

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::addHangLimitChecks(TranslateToFuzzReader *this,Function *func)

{
  Builder *pBVar1;
  ArrayNew *pAVar2;
  uint32_t uVar3;
  Expression *pEVar4;
  Block *pBVar5;
  Expression *pEVar6;
  Const *pCVar7;
  _Storage<wasm::Type,_true> extraout_RDX;
  pointer ppAVar8;
  pointer ppAVar9;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  FindAll<wasm::ArrayNew> local_50;
  TranslateToFuzzReader *local_38;
  
  local_38 = this;
  FindAll<wasm::Loop>::FindAll((FindAll<wasm::Loop> *)&local_50,func->body);
  ppAVar9 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar1 = &local_38->builder;
    ppAVar8 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = *ppAVar8;
      pEVar4 = makeHangLimitCheck(local_38);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)
           (pAVar2->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.type.id;
      pBVar5 = Builder::makeSequence
                         (pBVar1,pEVar4,
                          *(Expression **)
                           &pAVar2[1].super_SpecificExpression<(wasm::Expression::Id)70>.
                            super_Expression,type);
      *(Block **)&pAVar2[1].super_SpecificExpression<(wasm::Expression::Id)70>.super_Expression =
           pBVar5;
      ppAVar8 = ppAVar8 + 1;
    } while (ppAVar8 != ppAVar9);
  }
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.list.
                    super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pBVar1 = &local_38->builder;
  pEVar6 = makeHangLimitCheck(local_38);
  pEVar4 = func->body;
  wasm::HeapType::getSignature();
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = extraout_RDX;
  pBVar5 = Builder::makeSequence(pBVar1,pEVar6,pEVar4,type_00);
  func->body = (Expression *)pBVar5;
  FindAll<wasm::ArrayNew>::FindAll(&local_50,(Expression *)pBVar5);
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_38 = (TranslateToFuzzReader *)&local_38->random;
    ppAVar9 = local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar2 = *ppAVar9;
      uVar3 = Random::upTo((Random *)local_38,100);
      if (uVar3 != 0) {
        pEVar4 = pAVar2->size;
        pCVar7 = Builder::makeConst<int>(pBVar1,0x3ff);
        pEVar6 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
        pEVar6->_id = BinaryId;
        (pEVar6->type).id = 0;
        *(undefined4 *)(pEVar6 + 1) = 7;
        pEVar6[1].type.id = (uintptr_t)pEVar4;
        *(Const **)(pEVar6 + 2) = pCVar7;
        wasm::Binary::finalize();
        pAVar2->size = pEVar6;
      }
      ppAVar9 = ppAVar9 + 1;
    } while (ppAVar9 !=
             local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.list.super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.list.
                    super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.list.
                          super__Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitChecks(Function* func) {
  // loop limit
  for (auto* loop : FindAll<Loop>(func->body).list) {
    loop->body =
      builder.makeSequence(makeHangLimitCheck(), loop->body, loop->type);
  }
  // recursion limit
  func->body =
    builder.makeSequence(makeHangLimitCheck(), func->body, func->getResults());
  // ArrayNew can hang the fuzzer if the array size is massive. This doesn't
  // cause an OOM (which the fuzzer knows how to ignore) but it just works for
  // many seconds on building the array. To avoid that, limit the size with high
  // probability.
  for (auto* arrayNew : FindAll<ArrayNew>(func->body).list) {
    if (!oneIn(100)) {
      arrayNew->size = builder.makeBinary(
        AndInt32, arrayNew->size, builder.makeConst(int32_t(1024 - 1)));
    }
  }
}